

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSopToCubes(Abc_Ntk_t *pNtk,int fXor)

{
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNodeOld;
  int iVar1;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    Abc_NtkCleanCopy(pNtk);
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    p = Abc_NtkDfs(pNtk,0);
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pNodeOld = (Abc_Obj_t *)Vec_PtrEntry(p,iVar1);
      Abc_NodeSopToCubes(pNodeOld,pNtkNew,fXor);
    }
    Vec_PtrFree(p);
    Abc_NtkFinalize(pNtk,pNtkNew);
    iVar1 = Abc_NtkCheck(pNtkNew);
    if (iVar1 == 0) {
      puts("Abc_NtkSopToCubes: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xa21,"Abc_Ntk_t *Abc_NtkSopToCubes(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSopToCubes( Abc_Ntk_t * pNtk, int fXor )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int i;
    assert( Abc_NtkIsSopLogic(pNtk) );
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // perform conversion in the topological order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeSopToCubes( pNode, pNtkNew, fXor );
    Vec_PtrFree( vNodes );
    // make sure everything is okay
    Abc_NtkFinalize( pNtk, pNtkNew );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkSopToCubes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}